

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

_Bool request_passphrase(PageantClient *pc,PageantKey *pk)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (pk->decryption_prompt_active == false) {
    if (gui_request_in_progress == '\x01') {
      __assert_fail("!gui_request_in_progress",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                    0x198,"_Bool request_passphrase(PageantClient *, PageantKey *)");
    }
    _Var1 = (*pc->vt->ask_passphrase)(pc,&pk->dlgid,pk->comment);
    if (_Var1) {
      _Var1 = true;
      gui_request_in_progress = '\x01';
      pk->decryption_prompt_active = true;
    }
    else {
      _Var1 = false;
    }
  }
  return _Var1;
}

Assistant:

static bool request_passphrase(PageantClient *pc, PageantKey *pk)
{
    if (!pk->decryption_prompt_active) {
        assert(!gui_request_in_progress);

        bool created_dlg = pageant_client_ask_passphrase(
            pc, &pk->dlgid, pk->comment);

        if (!created_dlg)
            return false;

        gui_request_in_progress = true;
        pk->decryption_prompt_active = true;
    }

    return true;
}